

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_extswsli1(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
  tcg_gen_ext32s_i64_ppc64(tcg_ctx,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8)))
  ;
  tcg_gen_shli_i64_ppc64(tcg_ctx,ret,ret,(ulong)(uVar1 >> 0xb & 0x1f) | 0x20);
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  uVar1._0_1_ = ctx->sf_mode;
  uVar1._1_1_ = ctx->has_cfar;
  uVar1._2_1_ = ctx->fpu_enabled;
  uVar1._3_1_ = ctx->altivec_enabled;
  gen_set_Rc0((DisasContext_conflict10 *)(ulong)uVar1,(TCGv_i64)ctx->uc->tcg_ctx);
  return;
}

Assistant:

static void gen_extswsli1(DisasContext *ctx)
{
    gen_extswsli(ctx, 1);
}